

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolver.cpp
# Opt level: O2

void __thiscall
libtorrent::aux::resolver::on_lookup
          (resolver *this,error_code *ec,results_type *ips,string *hostname)

{
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::resolver::failed_dns_cache_entry,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::resolver::failed_dns_cache_entry>_>_>
  *this_00;
  pointer paVar1;
  _Base_ptr p_Var2;
  error_category *peVar3;
  callback_t h;
  callback_t h_00;
  undefined3 uVar4;
  bool bVar5;
  iterator k;
  mapped_type *pmVar6;
  time_point tVar7;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::resolver::failed_dns_cache_entry>,_true>
  _Var8;
  iterator __it;
  mapped_type *pmVar9;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::resolver::dns_cache_entry>,_true>
  _Var10;
  const_iterator cVar11;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::resolver::failed_dns_cache_entry>,_true>
  __it_00;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::resolver::dns_cache_entry>,_true>
  __it_01;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>_>_>,_std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>_>_>_>
  pVar12;
  multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>_>_>_>
  *pmVar13;
  undefined8 in_stack_fffffffffffffeb0;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::resolver::dns_cache_entry>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::resolver::dns_cache_entry>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *this_01;
  _Manager_type in_stack_fffffffffffffeb8;
  _Invoker_type in_stack_fffffffffffffec0;
  _Any_data local_138;
  _Base_ptr local_128;
  _Base_ptr local_120;
  _Any_data local_118;
  _Base_ptr local_108;
  _Base_ptr local_100;
  const_iterator __begin2;
  address local_d8;
  const_iterator __end2;
  basic_resolver_entry<boost::asio::ip::tcp> i;
  
  this_00 = &this->m_failed_cache;
  if (ec->failed_ == true) {
    pmVar6 = ::std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::resolver::failed_dns_cache_entry>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::resolver::failed_dns_cache_entry>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::resolver::failed_dns_cache_entry>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::resolver::failed_dns_cache_entry>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)this_00,hostname);
    tVar7 = time_now();
    (pmVar6->last_seen).__d.__r = (rep)tVar7.__d.__r;
    bVar5 = ec->failed_;
    uVar4 = *(undefined3 *)&ec->field_0x5;
    peVar3 = ec->cat_;
    (pmVar6->error).val_ = ec->val_;
    (pmVar6->error).failed_ = bVar5;
    *(undefined3 *)&(pmVar6->error).field_0x5 = uVar4;
    (pmVar6->error).cat_ = peVar3;
    if (this->m_max_size < (int)(this->m_failed_cache)._M_h._M_element_count) {
      _Var8._M_cur = (__node_type *)(this->m_failed_cache)._M_h._M_before_begin._M_nxt;
      __it_00._M_cur = _Var8._M_cur;
      for (; _Var8._M_cur != (__node_type *)0x0;
          _Var8._M_cur = (__node_type *)((_Var8._M_cur)->super__Hash_node_base)._M_nxt) {
        if (*(long *)((long)&((_Var8._M_cur)->
                             super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::resolver::failed_dns_cache_entry>,_true>
                             ).
                             super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::resolver::failed_dns_cache_entry>_>
                             ._M_storage._M_storage + 0x20) < *(long *)((long)__it_00._M_cur + 0x28)
           ) {
          __it_00._M_cur = _Var8._M_cur;
        }
      }
      ::std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::resolver::failed_dns_cache_entry>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::resolver::failed_dns_cache_entry>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::erase(&this_00->_M_h,(const_iterator)__it_00._M_cur);
    }
    pmVar13 = &this->m_callbacks;
    pVar12 = ::std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>_>_>_>
             ::equal_range(&pmVar13->_M_t,hostname);
    for (cVar11._M_node = (_Base_ptr)pVar12.first._M_node;
        cVar11._M_node != (_Base_ptr)pVar12.second._M_node;
        cVar11._M_node = (_Base_ptr)::std::_Rb_tree_increment(cVar11._M_node)) {
      local_118._M_unused._M_object = (void *)0x0;
      local_118._8_8_ = (_Base_ptr)0x0;
      local_108 = (_Base_ptr)0x0;
      local_100 = cVar11._M_node[2]._M_right;
      p_Var2 = cVar11._M_node[2]._M_left;
      if (p_Var2 != (_Base_ptr)0x0) {
        local_118._M_unused._0_8_ = (undefined8)*(undefined8 *)(cVar11._M_node + 2);
        local_118._8_8_ = cVar11._M_node[2]._M_parent;
        cVar11._M_node[2]._M_left = (_Base_ptr)0x0;
        cVar11._M_node[2]._M_right = (_Base_ptr)0x0;
        local_108 = p_Var2;
      }
      i.endpoint_.impl_.data_._0_8_ = 0;
      i.endpoint_.impl_.data_._8_1_ = '\0';
      i.endpoint_.impl_.data_._9_1_ = '\0';
      i.endpoint_.impl_.data_._10_1_ = '\0';
      i.endpoint_.impl_.data_._11_1_ = '\0';
      i.endpoint_.impl_.data_._12_1_ = '\0';
      i.endpoint_.impl_.data_._13_1_ = '\0';
      i.endpoint_.impl_.data_._14_1_ = '\0';
      i.endpoint_.impl_.data_._15_1_ = '\0';
      i.endpoint_.impl_.data_._16_8_ = 0;
      h_00.super__Function_base._M_functor._8_8_ = in_stack_fffffffffffffeb0;
      h_00.super__Function_base._M_functor._M_unused._M_object = pmVar13;
      h_00.super__Function_base._M_manager = in_stack_fffffffffffffeb8;
      h_00._M_invoker = in_stack_fffffffffffffec0;
      anon_unknown_5::callback
                (h_00,(error_code *)&local_118,
                 (vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_> *)ec);
      ::std::_Vector_base<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>::
      ~_Vector_base((_Vector_base<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>
                     *)&i);
      ::std::_Function_base::~_Function_base((_Function_base *)&local_118);
    }
    ::std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>_>_>_>
    ::_M_erase_aux(&pmVar13->_M_t,(_Base_ptr)pVar12.first._M_node,(_Base_ptr)pVar12.second._M_node);
  }
  else {
    __it = ::std::
           _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::resolver::failed_dns_cache_entry>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::resolver::failed_dns_cache_entry>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::find(&this_00->_M_h,hostname);
    if (__it.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::resolver::failed_dns_cache_entry>,_true>
        ._M_cur != (__node_type *)0x0) {
      ::std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::resolver::failed_dns_cache_entry>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::resolver::failed_dns_cache_entry>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::erase(&this_00->_M_h,
              (const_iterator)
              __it.
              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::resolver::failed_dns_cache_entry>,_true>
              ._M_cur);
    }
    this_01 = &(this->m_cache)._M_h;
    pmVar9 = ::std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::resolver::dns_cache_entry>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::resolver::dns_cache_entry>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::resolver::dns_cache_entry>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::resolver::dns_cache_entry>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)this_01,hostname);
    tVar7 = time_now();
    (pmVar9->last_seen).__d.__r = (rep)tVar7.__d.__r;
    paVar1 = (pmVar9->addresses).
             super__Vector_base<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((pmVar9->addresses).
        super__Vector_base<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>.
        _M_impl.super__Vector_impl_data._M_finish != paVar1) {
      (pmVar9->addresses).
      super__Vector_base<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>.
      _M_impl.super__Vector_impl_data._M_finish = paVar1;
    }
    boost::asio::ip::basic_resolver_results<boost::asio::ip::tcp>::begin(&__begin2,ips);
    __end2.values_.
    super___shared_ptr<std::vector<boost::asio::ip::basic_resolver_entry<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_resolver_entry<boost::asio::ip::tcp>_>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    __end2.values_.
    super___shared_ptr<std::vector<boost::asio::ip::basic_resolver_entry<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_resolver_entry<boost::asio::ip::tcp>_>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    __end2.index_ = 0;
    while( true ) {
      bVar5 = boost::asio::ip::operator!=(&__begin2,&__end2);
      if (!bVar5) break;
      boost::asio::ip::basic_resolver_entry<boost::asio::ip::tcp>::basic_resolver_entry
                (&i,((__begin2.values_.
                      super___shared_ptr<std::vector<boost::asio::ip::basic_resolver_entry<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_resolver_entry<boost::asio::ip::tcp>_>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr)->
                    super__Vector_base<boost::asio::ip::basic_resolver_entry<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_resolver_entry<boost::asio::ip::tcp>_>_>
                    )._M_impl.super__Vector_impl_data._M_start + __begin2.index_);
      if (i.endpoint_.impl_.data_.base.sa_family != 2) {
        local_d8.ipv6_address_.scope_id_ = (unsigned_long)i.endpoint_.impl_.data_.v6.sin6_scope_id;
        local_d8.ipv6_address_.addr_.__in6_u.__u6_addr8[0] = i.endpoint_.impl_.data_._8_1_;
        local_d8.ipv6_address_.addr_.__in6_u.__u6_addr8[1] = i.endpoint_.impl_.data_._9_1_;
        local_d8.ipv6_address_.addr_.__in6_u.__u6_addr8[2] = i.endpoint_.impl_.data_._10_1_;
        local_d8.ipv6_address_.addr_.__in6_u.__u6_addr8[3] = i.endpoint_.impl_.data_._11_1_;
        local_d8.ipv6_address_.addr_.__in6_u.__u6_addr8[4] = i.endpoint_.impl_.data_._12_1_;
        local_d8.ipv6_address_.addr_.__in6_u.__u6_addr8[5] = i.endpoint_.impl_.data_._13_1_;
        local_d8.ipv6_address_.addr_.__in6_u.__u6_addr8[6] = i.endpoint_.impl_.data_._14_1_;
        local_d8.ipv6_address_.addr_.__in6_u.__u6_addr8[7] = i.endpoint_.impl_.data_._15_1_;
        local_d8.ipv6_address_.addr_.__in6_u._8_8_ = i.endpoint_.impl_.data_._16_8_;
        local_d8.ipv4_address_.addr_.s_addr = (in4_addr_type)0;
      }
      else {
        local_d8.ipv6_address_.addr_.__in6_u.__u6_addr8[0] = '\0';
        local_d8.ipv6_address_.addr_.__in6_u.__u6_addr8[1] = '\0';
        local_d8.ipv6_address_.addr_.__in6_u.__u6_addr8[2] = '\0';
        local_d8.ipv6_address_.addr_.__in6_u.__u6_addr8[3] = '\0';
        local_d8.ipv6_address_.addr_.__in6_u.__u6_addr8[4] = '\0';
        local_d8.ipv6_address_.addr_.__in6_u.__u6_addr8[5] = '\0';
        local_d8.ipv6_address_.addr_.__in6_u.__u6_addr8[6] = '\0';
        local_d8.ipv6_address_.addr_.__in6_u.__u6_addr8[7] = '\0';
        local_d8.ipv6_address_.addr_.__in6_u._8_8_ = 0;
        local_d8.ipv6_address_.scope_id_ = 0;
        local_d8.ipv4_address_.addr_.s_addr =
             (in4_addr_type)(in4_addr_type)i.endpoint_.impl_.data_.v6.sin6_flowinfo;
      }
      local_d8.type_ = (anon_enum_32)(i.endpoint_.impl_.data_.base.sa_family != 2);
      ::std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>::
      emplace_back<boost::asio::ip::address>(&pmVar9->addresses,&local_d8);
      boost::asio::ip::basic_resolver_entry<boost::asio::ip::tcp>::~basic_resolver_entry(&i);
      boost::asio::ip::basic_resolver_iterator<boost::asio::ip::tcp>::increment(&__begin2);
    }
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&__end2.values_.
                super___shared_ptr<std::vector<boost::asio::ip::basic_resolver_entry<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_resolver_entry<boost::asio::ip::tcp>_>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&__begin2.values_.
                super___shared_ptr<std::vector<boost::asio::ip::basic_resolver_entry<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_resolver_entry<boost::asio::ip::tcp>_>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    pmVar13 = &this->m_callbacks;
    pVar12 = ::std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>_>_>_>
             ::equal_range(&pmVar13->_M_t,hostname);
    for (cVar11._M_node = (_Base_ptr)pVar12.first._M_node;
        cVar11._M_node != (_Base_ptr)pVar12.second._M_node;
        cVar11._M_node = (_Base_ptr)::std::_Rb_tree_increment(cVar11._M_node)) {
      local_138._M_unused._M_object = (void *)0x0;
      local_138._8_8_ = (_Base_ptr)0x0;
      local_128 = (_Base_ptr)0x0;
      local_120 = cVar11._M_node[2]._M_right;
      p_Var2 = cVar11._M_node[2]._M_left;
      if (p_Var2 != (_Base_ptr)0x0) {
        local_138._M_unused._0_8_ = (undefined8)*(undefined8 *)(cVar11._M_node + 2);
        local_138._8_8_ = cVar11._M_node[2]._M_parent;
        cVar11._M_node[2]._M_left = (_Base_ptr)0x0;
        cVar11._M_node[2]._M_right = (_Base_ptr)0x0;
        local_128 = p_Var2;
      }
      h.super__Function_base._M_functor._8_8_ = this_01;
      h.super__Function_base._M_functor._M_unused._M_function_pointer = (_func_void *)this;
      h.super__Function_base._M_manager = (_Manager_type)pmVar13;
      h._M_invoker = (_Invoker_type)hostname;
      anon_unknown_5::callback
                (h,(error_code *)&local_138,
                 (vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_> *)ec);
      ::std::_Function_base::~_Function_base((_Function_base *)&local_138);
    }
    ::std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>_>_>_>
    ::_M_erase_aux(&pmVar13->_M_t,(_Base_ptr)pVar12.first._M_node,(_Base_ptr)pVar12.second._M_node);
    if (this->m_max_size < (int)(this->m_cache)._M_h._M_element_count) {
      _Var10._M_cur = (__node_type *)(this->m_cache)._M_h._M_before_begin._M_nxt;
      __it_01._M_cur = _Var10._M_cur;
      for (; _Var10._M_cur != (__node_type *)0x0;
          _Var10._M_cur = (__node_type *)((_Var10._M_cur)->super__Hash_node_base)._M_nxt) {
        if (*(long *)((long)&((_Var10._M_cur)->
                             super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::resolver::dns_cache_entry>,_true>
                             ).
                             super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::resolver::dns_cache_entry>_>
                             ._M_storage._M_storage + 0x20) < *(long *)((long)__it_01._M_cur + 0x28)
           ) {
          __it_01._M_cur = _Var10._M_cur;
        }
      }
      ::std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::resolver::dns_cache_entry>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::resolver::dns_cache_entry>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::erase(this_01,(const_iterator)__it_01._M_cur);
    }
  }
  return;
}

Assistant:

void resolver::on_lookup(error_code const& ec, tcp::resolver::results_type ips
		, std::string const& hostname)
	{
		COMPLETE_ASYNC("resolver::on_lookup");
		if (ec)
		{
			failed_dns_cache_entry& ce = m_failed_cache[hostname];
			ce.last_seen = time_now();
			ce.error = ec;

			// if the cache grows too big, weed out the
			// oldest entries
			if (int(m_failed_cache.size()) > m_max_size)
			{
				auto oldest = m_failed_cache.begin();
				for (auto k = m_failed_cache.begin(); k != m_failed_cache.end(); ++k)
				{
					if (k->second.last_seen < oldest->second.last_seen)
						oldest = k;
				}

				// remove the oldest entry
				m_failed_cache.erase(oldest);
			}

			auto const range = m_callbacks.equal_range(hostname);
			for (auto c = range.first; c != range.second; ++c)
				callback(std::move(c->second), ec, {});
			m_callbacks.erase(range.first, range.second);
			return;
		}

		{
			auto const k = m_failed_cache.find(hostname);
			if (k != m_failed_cache.end())
				m_failed_cache.erase(k);
		}

		dns_cache_entry& ce = m_cache[hostname];
		ce.last_seen = time_now();
		ce.addresses.clear();
		for (auto i : ips)
			ce.addresses.push_back(i.endpoint().address());

		auto const range = m_callbacks.equal_range(hostname);
		for (auto c = range.first; c != range.second; ++c)
			callback(std::move(c->second), ec, ce.addresses);
		m_callbacks.erase(range.first, range.second);

		// if m_cache grows too big, weed out the
		// oldest entries
		if (int(m_cache.size()) > m_max_size)
		{
			auto oldest = m_cache.begin();
			for (auto k = m_cache.begin(); k != m_cache.end(); ++k)
			{
				if (k->second.last_seen < oldest->second.last_seen)
					oldest = k;
			}

			// remove the oldest entry
			m_cache.erase(oldest);
		}
	}